

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O1

bool gmath::recoverEuler(Matrix33d *R,double *ax,double *ay,double *az,bool tolerant)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  int iVar29;
  int iVar30;
  double dVar31;
  long lVar32;
  double *pdVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  double local_158;
  undefined8 uStack_150;
  double local_f8 [4];
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  undefined8 local_98;
  double local_90;
  undefined8 local_88;
  undefined8 local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  undefined8 local_58;
  double local_50;
  double local_48;
  double local_40;
  
  dVar31 = R->v[0][2];
  if (0.9999999999 <= ABS(dVar31)) {
    *ax = 0.0;
    if (dVar31 <= 0.0) {
      dVar31 = 1.5707963267948966;
    }
    else {
      dVar31 = -1.5707963267948966;
    }
    *ay = dVar31;
    dVar4 = asin(R->v[1][0]);
    *az = dVar4;
    dVar31 = R->v[1][1];
    dVar4 = cos(dVar4);
    if (ABS(dVar31 - dVar4) <= 1e-06) goto LAB_00151ef9;
    dVar31 = 3.141592653589793 - *az;
  }
  else {
    local_f8[1] = asin(-dVar31);
    local_90 = 3.141592653589793 - local_f8[1];
    dVar31 = R->v[1][2];
    local_d8 = local_f8[1];
    local_c0 = local_f8[1];
    local_a8 = local_f8[1];
    local_78 = local_90;
    local_60 = local_90;
    local_48 = local_90;
    dVar4 = cos(local_f8[1]);
    if ((ABS(dVar31 / dVar4) <= 1.0) ||
       (dVar31 = R->v[1][2], dVar4 = cos(local_90), ABS(dVar31 / dVar4) <= 1.0)) {
      local_158 = -R->v[1][2];
      dVar31 = cos(local_f8[1]);
      local_f8[0] = asin(local_158 / dVar31);
      local_c8 = 3.141592653589793 - local_f8[0];
      local_158 = -R->v[1][2];
      local_f8[3] = local_f8[0];
      local_b0 = local_c8;
      dVar31 = cos(local_90);
      dVar31 = asin(local_158 / dVar31);
      uVar34 = SUB84(dVar31,0);
      uVar35 = (undefined4)((ulong)dVar31 >> 0x20);
    }
    else {
      dVar31 = R->v[2][2];
      dVar4 = cos(local_f8[1]);
      local_f8[0] = acos(dVar31 / dVar4);
      local_c8 = 3.141592653589793 - local_f8[0];
      dVar31 = R->v[2][2];
      local_f8[3] = local_f8[0];
      local_b0 = local_c8;
      dVar4 = cos(local_90);
      dVar31 = acos(dVar31 / dVar4);
      uVar34 = SUB84(dVar31,0);
      uVar35 = (undefined4)((ulong)dVar31 >> 0x20);
    }
    local_80 = CONCAT44(uVar35,uVar34);
    local_98 = CONCAT44(uVar35,uVar34);
    local_68 = 3.141592653589793 - (double)CONCAT44(uVar35,uVar34);
    dVar31 = R->v[0][1];
    local_50 = local_68;
    dVar4 = cos(local_f8[1]);
    if ((ABS(dVar31 / dVar4) <= 1.0) ||
       (dVar31 = R->v[0][1], dVar4 = cos(local_90), ABS(dVar31 / dVar4) <= 1.0)) {
      local_158 = -R->v[0][1];
      dVar31 = cos(local_f8[1]);
      local_f8[2] = asin(local_158 / dVar31);
      local_d0 = 3.141592653589793 - local_f8[2];
      local_158 = -R->v[0][1];
      local_b8 = local_f8[2];
      local_a0 = local_d0;
      dVar31 = cos(local_90);
      dVar31 = asin(local_158 / dVar31);
      uVar34 = SUB84(dVar31,0);
      uVar35 = (undefined4)((ulong)dVar31 >> 0x20);
    }
    else {
      dVar31 = R->v[0][0];
      dVar4 = cos(local_f8[1]);
      local_f8[2] = acos(dVar31 / dVar4);
      local_d0 = 3.141592653589793 - local_f8[2];
      dVar31 = R->v[0][0];
      local_b8 = local_f8[2];
      local_a0 = local_d0;
      dVar4 = cos(local_90);
      dVar31 = acos(dVar31 / dVar4);
      uVar34 = SUB84(dVar31,0);
      uVar35 = (undefined4)((ulong)dVar31 >> 0x20);
    }
    pdVar33 = local_f8 + 2;
    local_58 = CONCAT44(uVar35,uVar34);
    local_88 = CONCAT44(uVar35,uVar34);
    local_40 = 3.141592653589793 - (double)CONCAT44(uVar35,uVar34);
    local_70 = local_40;
    iVar30 = -1;
    lVar32 = 0;
    dVar31 = 0.0;
    do {
      local_158 = R->v[0][0];
      dVar5 = cos(pdVar33[-1]);
      dVar6 = cos(*pdVar33);
      dVar4 = R->v[2][2];
      uStack_150._0_4_ = SUB84(dVar4,0);
      uStack_150._4_4_ = (int)((ulong)dVar4 >> 0x20);
      dVar7 = cos(pdVar33[-2]);
      dVar8 = cos(pdVar33[-1]);
      dVar4 = R->v[1][0];
      dVar9 = sin(pdVar33[-2]);
      dVar10 = sin(pdVar33[-1]);
      dVar11 = cos(*pdVar33);
      dVar12 = cos(pdVar33[-2]);
      dVar13 = sin(*pdVar33);
      dVar1 = R->v[1][1];
      dVar14 = sin(pdVar33[-2]);
      dVar15 = sin(pdVar33[-1]);
      dVar16 = sin(*pdVar33);
      dVar17 = cos(pdVar33[-2]);
      dVar18 = cos(*pdVar33);
      dVar2 = R->v[2][0];
      dVar19 = cos(pdVar33[-2]);
      dVar20 = sin(pdVar33[-1]);
      dVar21 = cos(*pdVar33);
      dVar22 = sin(pdVar33[-2]);
      dVar23 = sin(*pdVar33);
      dVar3 = R->v[2][1];
      dVar24 = cos(pdVar33[-2]);
      dVar25 = sin(pdVar33[-1]);
      dVar26 = sin(*pdVar33);
      dVar27 = sin(pdVar33[-2]);
      dVar28 = cos(*pdVar33);
      dVar4 = ABS((dVar26 * dVar25 * dVar24 + dVar3) - dVar28 * dVar27) +
              ABS((dVar2 - dVar20 * dVar19 * dVar21) - dVar23 * dVar22) +
              ABS((dVar1 - dVar15 * dVar14 * dVar16) - dVar18 * dVar17) +
              ABS((dVar11 * dVar10 * dVar9 + dVar4) - dVar13 * dVar12) +
              ABS(uStack_150 - dVar8 * dVar7) + ABS(local_158 - dVar6 * dVar5);
      iVar29 = (int)lVar32;
      if (dVar31 <= dVar4 && -1 < iVar30) {
        dVar4 = dVar31;
        iVar29 = iVar30;
      }
      iVar30 = iVar29;
      lVar32 = lVar32 + 1;
      pdVar33 = pdVar33 + 3;
      dVar31 = dVar4;
    } while (lVar32 != 8);
    if ((!tolerant) && (1e-06 < dVar4)) {
      return false;
    }
    lVar32 = (long)iVar30;
    *ax = local_f8[lVar32 * 3];
    *ay = local_f8[lVar32 * 3 + 1];
    dVar31 = local_f8[lVar32 * 3 + 2];
  }
  *az = dVar31;
LAB_00151ef9:
  dVar31 = *ax;
  if (dVar31 <= 3.141592653589793) {
    do {
      dVar31 = dVar31 + 6.283185307179586;
    } while (dVar31 <= 3.141592653589793);
    *ax = dVar31;
  }
  dVar31 = *ax;
  if (3.141592653589793 < dVar31) {
    do {
      dVar31 = dVar31 + -6.283185307179586;
    } while (3.141592653589793 < dVar31);
    *ax = dVar31;
  }
  dVar31 = *ay;
  if (dVar31 <= 3.141592653589793) {
    do {
      dVar31 = dVar31 + 6.283185307179586;
    } while (dVar31 <= 3.141592653589793);
    *ay = dVar31;
  }
  dVar31 = *ay;
  if (3.141592653589793 < dVar31) {
    do {
      dVar31 = dVar31 + -6.283185307179586;
    } while (3.141592653589793 < dVar31);
    *ay = dVar31;
  }
  dVar31 = *az;
  if (dVar31 <= 3.141592653589793) {
    do {
      dVar31 = dVar31 + 6.283185307179586;
    } while (dVar31 <= 3.141592653589793);
    *az = dVar31;
  }
  dVar31 = *az;
  if (3.141592653589793 < dVar31) {
    do {
      dVar31 = dVar31 + -6.283185307179586;
    } while (3.141592653589793 < dVar31);
    *az = dVar31;
  }
  return true;
}

Assistant:

bool recoverEuler(const Matrix33d &R, double &ax, double &ay, double &az, bool tolerant)
{
  // checking if cos(ay) is 0 or not

  if (std::abs(R(0, 2)) < 1.0-1e-10)
  {
    double pos[8][3];

    // cos(ay) is not 0

    // creating 8 possible sets of angles: two possibilities for ay

    pos[0][1]=pos[1][1]=pos[2][1]=pos[3][1]=asin(-R(0, 2));
    pos[4][1]=pos[5][1]=pos[6][1]=pos[7][1]=pi-pos[0][1];

    // for each possibility of ay there are two possibilities of ax

    if (std::abs(R(1, 2)/cos(pos[0][1])) <= 1 || std::abs(R(1, 2)/cos(pos[4][1])) <= 1)
    {
      pos[0][0]=pos[1][0]=asin(-R(1, 2)/cos(pos[0][1]));
      pos[2][0]=pos[3][0]=pi-pos[0][0];

      pos[4][0]=pos[5][0]=asin(-R(1, 2)/cos(pos[4][1]));
      pos[6][0]=pos[7][0]=pi-pos[4][0];
    }
    else
    {
      pos[0][0]=pos[1][0]=acos(R(2, 2)/cos(pos[0][1]));
      pos[2][0]=pos[3][0]=pi-pos[0][0];

      pos[4][0]=pos[5][0]=acos(R(2, 2)/cos(pos[4][1]));
      pos[6][0]=pos[7][0]=pi-pos[4][0];
    }

    // for each possibility of ay there are two possibilities of az as
    // well, which have to be combined with all possibilities of ax

    if (std::abs(R(0, 1)/cos(pos[0][1])) <= 1 || std::abs(R(0, 1)/cos(pos[4][1])) <= 1)
    {
      pos[0][2]=pos[2][2]=asin(-R(0, 1)/cos(pos[0][1]));
      pos[1][2]=pos[3][2]=pi-pos[0][2];

      pos[4][2]=pos[6][2]=asin(-R(0, 1)/cos(pos[4][1]));
      pos[5][2]=pos[7][2]=pi-pos[4][2];
    }
    else
    {
      pos[0][2]=pos[2][2]=acos(R(0, 0)/cos(pos[0][1]));
      pos[1][2]=pos[3][2]=pi-pos[0][2];

      pos[4][2]=pos[6][2]=acos(R(0, 0)/cos(pos[4][1]));
      pos[5][2]=pos[7][2]=pi-pos[4][2];
    }

    // check all 8 possible sets of angles with the remaining 6 equations
    // and use the set with the lowest error

    int k=-1;
    double emin=0;

    for (int i=0; i<8; i++)
    {
      double e;

      e=std::abs(R(0, 0)-cos(pos[i][1])*cos(pos[i][2]));

      e+=std::abs(R(2, 2)-cos(pos[i][0])*cos(pos[i][1]));

      e+=std::abs(R(1, 0)+sin(pos[i][0])*sin(pos[i][1])*
                  cos(pos[i][2])-cos(pos[i][0])*sin(pos[i][2]));

      e+=std::abs(R(1, 1)-sin(pos[i][0])*sin(pos[i][1])*
                  sin(pos[i][2])-cos(pos[i][0])*cos(pos[i][2]));

      e+=std::abs(R(2, 0)-cos(pos[i][0])*sin(pos[i][1])*
                  cos(pos[i][2])-sin(pos[i][0])*sin(pos[i][2]));

      e+=std::abs(R(2, 1)+cos(pos[i][0])*sin(pos[i][1])*
                  sin(pos[i][2])-sin(pos[i][0])*cos(pos[i][2]));

      if (k < 0 || e < emin)
      {
        k=i;
        emin=e;
      }
    }

    if (!tolerant && emin > 1e-6)
    {
      return false;
    }

    ax=pos[k][0];
    ay=pos[k][1];
    az=pos[k][2];
  }
  else
  {
    // cos(ay) is 0

    if (R(0, 2) > 0.0)
    {
      ax=0.0;
      ay=-pi/2.0;
      az=asin(R(1, 0));

      if (std::abs(R(1, 1)-cos(az)) > 1e-6)
      {
        az=pi-az;
      }
    }
    else
    {
      ax=0.0;
      ay=pi/2.0;
      az=asin(R(1, 0));

      if (std::abs(R(1, 1)-cos(az)) > 1e-6)
      {
        az=pi-az;
      }
    }
  }

  // make sure that for all angles -PI < a <= PI

  while (ax <= pi)
  {
    ax+=2.0*pi;
  }

  while (ax > pi)
  {
    ax-=2.0*pi;
  }

  while (ay <= pi)
  {
    ay+=2.0*pi;
  }

  while (ay > pi)
  {
    ay-=2.0*pi;
  }

  while (az <= pi)
  {
    az+=2.0*pi;
  }

  while (az > pi)
  {
    az-=2.0*pi;
  }

  return true;
}